

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

size_t mg_websocket_printf(mg_connection *conn,int opcode,char *fmt,...)

{
  char in_AL;
  uint uVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *buf;
  va_list ap;
  char mem [4192];
  char *local_1150;
  __va_list_tag local_1148;
  undefined1 local_1128 [24];
  undefined8 local_1110;
  undefined8 local_1108;
  undefined8 local_1100;
  undefined8 local_10f8;
  undefined8 local_10e8;
  undefined8 local_10d8;
  undefined8 local_10c8;
  undefined8 local_10b8;
  undefined8 local_10a8;
  undefined8 local_1098;
  undefined8 local_1088;
  char local_1078 [4192];
  
  local_1148.reg_save_area = local_1128;
  if (in_AL != '\0') {
    local_10f8 = in_XMM0_Qa;
    local_10e8 = in_XMM1_Qa;
    local_10d8 = in_XMM2_Qa;
    local_10c8 = in_XMM3_Qa;
    local_10b8 = in_XMM4_Qa;
    local_10a8 = in_XMM5_Qa;
    local_1098 = in_XMM6_Qa;
    local_1088 = in_XMM7_Qa;
  }
  local_1148.overflow_arg_area = &buf;
  local_1148.gp_offset = 0x18;
  local_1148.fp_offset = 0x30;
  local_1150 = local_1078;
  local_1110 = in_RCX;
  local_1108 = in_R8;
  local_1100 = in_R9;
  uVar1 = ns_avprintf(&local_1150,0x1060,fmt,&local_1148);
  if (0 < (int)uVar1) {
    mg_websocket_write(conn,opcode,local_1150,(ulong)uVar1);
  }
  if (local_1150 != (char *)0x0 && local_1150 != local_1078) {
    free(local_1150);
  }
  return *(size_t *)((long)conn[-1].callback_param + 0x58);
}

Assistant:

size_t mg_websocket_printf(struct mg_connection *conn, int opcode,
                           const char *fmt, ...) {
  char mem[4192], *buf = mem;
  va_list ap;
  int len;

  va_start(ap, fmt);
  if ((len = ns_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
    mg_websocket_write(conn, opcode, buf, len);
  }
  va_end(ap);

  if (buf != mem && buf != NULL) {
    free(buf);
  }

  return MG_CONN_2_CONN(conn)->ns_conn->send_iobuf.len;
}